

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int get_utf8_char_len(uchar ch)

{
  undefined4 local_c;
  uchar ch_local;
  
  if ((ch & 0x80) == 0) {
    local_c = 1;
  }
  else if ((ch & 0xf0) == 0xe0) {
    local_c = 3;
  }
  else if ((ch & 0xf0) == 0xf0) {
    local_c = 4;
  }
  else {
    local_c = 2;
  }
  return local_c;
}

Assistant:

static int get_utf8_char_len(unsigned char ch) {
    if ((ch & 0x80) == 0) return 1;
    switch (ch & 0xf0) {
        case 0xf0:
            return 4;
        case 0xe0:
            return 3;
        default:
            return 2;
    }
}